

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void xPredIntraAngAdi_XY_14(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pel *dst4;
  pel *dst3;
  pel *dst2;
  pel *dst1;
  pel *pfirst [4];
  int aligned_line_size;
  int left_size;
  int line_size;
  pel first_line [320];
  int local_2c;
  int i;
  int iHeight_local;
  int iWidth_local;
  int uiDirMode_local;
  int i_dst_local;
  pel *dst_local;
  pel *pSrc_local;
  
  if (iHeight == 4) {
    dst_local = pSrc;
    for (local_2c = 0; local_2c < iWidth; local_2c = local_2c + 1) {
      dst[local_2c] =
           (pel)((int)((uint)dst_local[-1] + (uint)*dst_local * 5 + (uint)dst_local[1] * 7 +
                       (uint)dst_local[2] * 3 + 8) >> 4);
      dst[(long)local_2c + (long)i_dst] =
           (pel)((int)((uint)dst_local[-1] + ((uint)*dst_local + (uint)dst_local[1]) * 3 +
                       (uint)dst_local[2] + 4) >> 3);
      dst[(long)local_2c + (long)i_dst + (long)i_dst] =
           (pel)((int)((uint)dst_local[-1] * 3 + (uint)*dst_local * 7 + (uint)dst_local[1] * 5 +
                       (uint)dst_local[2] + 8) >> 4);
      dst[(long)local_2c + (long)i_dst + (long)i_dst + (long)i_dst] =
           (pel)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
      dst_local = dst_local + 1;
    }
  }
  else {
    iVar4 = iWidth + iHeight / 4;
    iVar5 = iVar4 + -1;
    iVar6 = iVar5 - iWidth;
    iVar4 = iVar4 + 0xe >> 4;
    lVar1 = (long)(iVar4 * 0x10) + -0x178;
    lVar2 = (long)(iVar4 << 5) + -0x178;
    lVar3 = (long)(iVar4 * 0x30) + -0x178;
    dst_local = pSrc + -(long)(iHeight + -4);
    for (local_2c = 0; local_2c < iVar6; local_2c = local_2c + 1) {
      *(char *)((long)&left_size + (long)local_2c) =
           (char)((int)((uint)dst_local[2] + (uint)dst_local[3] * 2 + (uint)dst_local[4] + 2) >> 2);
      *(char *)((long)&left_size + local_2c + lVar1 + 0x178) =
           (char)((int)((uint)dst_local[1] + (uint)dst_local[2] * 2 + (uint)dst_local[3] + 2) >> 2);
      *(char *)((long)&left_size + local_2c + lVar2 + 0x178) =
           (char)((int)((uint)*dst_local + (uint)dst_local[1] * 2 + (uint)dst_local[2] + 2) >> 2);
      *(char *)((long)&left_size + local_2c + lVar3 + 0x178) =
           (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
      dst_local = dst_local + 4;
    }
    for (; local_2c < iVar5; local_2c = local_2c + 1) {
      *(char *)((long)&left_size + (long)local_2c) =
           (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 5 + (uint)dst_local[1] * 7 +
                        (uint)dst_local[2] * 3 + 8) >> 4);
      *(char *)((long)&left_size + local_2c + lVar1 + 0x178) =
           (char)((int)((uint)dst_local[-1] + ((uint)*dst_local + (uint)dst_local[1]) * 3 +
                        (uint)dst_local[2] + 4) >> 3);
      *(char *)((long)&left_size + local_2c + lVar2 + 0x178) =
           (char)((int)((uint)dst_local[-1] * 3 + (uint)*dst_local * 7 + (uint)dst_local[1] * 5 +
                        (uint)dst_local[2] + 8) >> 4);
      *(char *)((long)&left_size + local_2c + lVar3 + 0x178) =
           (char)((int)((uint)dst_local[-1] + (uint)*dst_local * 2 + (uint)dst_local[1] + 2) >> 2);
      dst_local = dst_local + 1;
    }
    _uiDirMode_local = dst;
    for (local_2c = 0; local_2c < iHeight / 4; local_2c = local_2c + 1) {
      memcpy(_uiDirMode_local,(void *)((long)&left_size + ((long)iVar6 - (long)local_2c)),
             (long)iWidth);
      _uiDirMode_local = _uiDirMode_local + i_dst;
      memcpy(_uiDirMode_local,
             (void *)((long)&left_size + ((iVar6 + lVar1) - (long)local_2c) + 0x178),(long)iWidth);
      _uiDirMode_local = _uiDirMode_local + i_dst;
      memcpy(_uiDirMode_local,
             (void *)((long)&left_size + ((iVar6 + lVar2) - (long)local_2c) + 0x178),(long)iWidth);
      memcpy(_uiDirMode_local + i_dst,
             (void *)((long)&left_size + ((iVar6 + lVar3) - (long)local_2c) + 0x178),(long)iWidth);
      _uiDirMode_local = _uiDirMode_local + i_dst + i_dst;
    }
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_14(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    int i;

    if (iHeight != 4) {
        ALIGNED_16(pel first_line[4 * (64 + 16)]);
        int line_size = iWidth + iHeight / 4 - 1;
        int left_size = line_size - iWidth;
        int aligned_line_size = ((line_size + 15) >> 4) << 4;
        pel *pfirst[4] = { first_line, first_line + aligned_line_size, first_line + aligned_line_size * 2, first_line + aligned_line_size * 3 };

        pSrc -= iHeight - 4;
        for (i = 0; i < left_size; i++, pSrc += 4) {
            pfirst[0][i] = (pSrc[2] + pSrc[3] * 2 + pSrc[4] + 2) >> 2;
            pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
            pfirst[2][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        for (; i < line_size; i++, pSrc++) {
            pfirst[0][i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            pfirst[1][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            pfirst[2][i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            pfirst[3][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }

        pfirst[0] += left_size;
        pfirst[1] += left_size;
        pfirst[2] += left_size;
        pfirst[3] += left_size;

        iHeight /= 4;

        for (i = 0; i < iHeight; i++) {
            memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[1] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[2] - i, iWidth * sizeof(pel));
            dst += i_dst;
            memcpy(dst, pfirst[3] - i, iWidth * sizeof(pel));
            dst += i_dst;
        }
    }
    else {
        pel *dst1 = dst;
        pel *dst2 = dst1 + i_dst;
        pel *dst3 = dst2 + i_dst;
        pel *dst4 = dst3 + i_dst;

        for (i = 0; i < iWidth; i++, pSrc++) {
            dst1[i] = (pSrc[-1] + pSrc[0] * 5 + pSrc[1] * 7 + pSrc[2] * 3 + 8) >> 4;
            dst2[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
            dst3[i] = (pSrc[-1] * 3 + pSrc[0] * 7 + pSrc[1] * 5 + pSrc[2] + 8) >> 4;
            dst4[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
        }
    }
}